

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_ellipse.cpp
# Opt level: O0

bool __thiscall ON_Ellipse::Create(ON_Ellipse *this,ON_Circle *c)

{
  bool bVar1;
  ON_Plane *p;
  double rx;
  double ry;
  ON_Circle *c_local;
  ON_Ellipse *this_local;
  
  p = ON_Circle::Plane(c);
  rx = ON_Circle::Radius(c);
  ry = ON_Circle::Radius(c);
  bVar1 = Create(this,p,rx,ry);
  return bVar1;
}

Assistant:

bool ON_Ellipse::Create( const ON_Circle& c )
{
  return Create( c.Plane(), c.Radius(), c.Radius() );
}